

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printIf(JSPrinter *this,Ref node)

{
  bool bVar1;
  undefined8 *puVar2;
  bool emitsBracesAnyhow_1;
  bool emitsBracesAnyhow;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"if");
  safeSpace(this);
  emit(this,'(');
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar2);
  emit(this,')');
  space(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  bVar1 = isBlock((Value *)*puVar2);
  if (!bVar1) {
    emit(this,'{');
    this->indent = this->indent + 1;
    newline(this);
  }
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar2);
  if (!bVar1) {
    this->indent = this->indent + -1;
    newline(this);
    emit(this,'}');
  }
  bVar1 = ifHasElse((Ref)this_local);
  if (bVar1) {
    space(this);
    emit(this,"else");
    safeSpace(this);
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
    bVar1 = isBlock((Value *)*puVar2);
    if (!bVar1) {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
    }
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
    print(this,(Value *)*puVar2);
    if (!bVar1) {
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
    }
  }
  return;
}

Assistant:

void printIf(Ref node) {
    emit("if");
    safeSpace();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    bool emitsBracesAnyhow = isBlock(node[2]);
    if (!emitsBracesAnyhow) {
      emit('{');
      indent++;
      newline();
    }
    print(node[2]);
    if (!emitsBracesAnyhow) {
      indent--;
      newline();
      emit('}');
    }
    if (ifHasElse(node)) {
      space();
      emit("else");
      safeSpace();
      bool emitsBracesAnyhow = isBlock(node[3]);
      if (!emitsBracesAnyhow) {
        emit('{');
        indent++;
        newline();
      }
      print(node[3]);
      if (!emitsBracesAnyhow) {
        indent--;
        newline();
        emit('}');
      }
    }
  }